

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::WriteTable(Table *table,size_t *offset,uint8_t *dst,size_t dst_size)

{
  bool bVar1;
  ulong __n;
  size_t padding_size;
  size_t dst_size_local;
  uint8_t *dst_local;
  size_t *offset_local;
  Table *table_local;
  
  bVar1 = WriteTableRecord(table,offset,dst,dst_size);
  if (!bVar1) {
    return false;
  }
  bVar1 = Font::Table::IsReused(table);
  if (!bVar1) {
    if ((table->offset + table->length < table->offset) ||
       (dst_size < table->offset + table->length)) {
      return false;
    }
    memcpy(dst + table->offset,table->data,(ulong)table->length);
    __n = (ulong)(4 - (table->length & 3) & 3);
    if (((table->offset + table->length) + __n < __n) ||
       (dst_size < (table->offset + table->length) + __n)) {
      return false;
    }
    memset(dst + (ulong)table->length + (ulong)table->offset,0,__n);
  }
  return true;
}

Assistant:

bool WriteTable(const Font::Table& table, size_t* offset, uint8_t* dst,
                size_t dst_size) {
  if (!WriteTableRecord(&table, offset, dst, dst_size)) {
    return false;
  }

  // Write the actual table data if it's the first time we've seen it
  if (!table.IsReused()) {
    if (table.offset + table.length < table.offset ||
        dst_size < table.offset + table.length) {
      return FONT_COMPRESSION_FAILURE();
    }
    memcpy(dst + table.offset, table.data, table.length);
    size_t padding_size = (4 - (table.length & 3)) & 3;
    if (table.offset + table.length + padding_size < padding_size ||
        dst_size < table.offset + table.length + padding_size) {
      return FONT_COMPRESSION_FAILURE();
    }
    memset(dst + table.offset + table.length, 0, padding_size);
  }
  return true;
}